

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaLoader.cpp
# Opt level: O2

aiMesh * __thiscall
Assimp::ColladaLoader::CreateMesh
          (ColladaLoader *this,ColladaParser *pParser,Mesh *pSrcMesh,SubMesh *pSubMesh,
          Controller *pSrcController,size_t pStartVertex,size_t pStartFace)

{
  AccessorLibrary *pLibrary;
  ulong uVar1;
  pointer paVar2;
  long lVar3;
  Mesh *pSrcMesh_00;
  aiMesh *mesh;
  unsigned_long uVar4;
  size_t sVar5;
  undefined1 auVar6 [16];
  __type _Var7;
  __uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true> this_00;
  size_t sVar8;
  aiVector3D *paVar9;
  void *pvVar10;
  ulong *puVar11;
  DataLibrary *pLibrary_00;
  Mesh **ppMVar12;
  Accessor *pAVar13;
  Accessor *pAVar14;
  Data *pDVar15;
  Data *pDVar16;
  const_reference pURL;
  const_reference pSubMesh_00;
  const_reference __x;
  _Base_ptr p_Var17;
  reference ppaVar18;
  aiMesh *paVar19;
  reference ppaVar20;
  Accessor *pAVar21;
  Data *pData;
  pointer ppVar22;
  aiBone *this_01;
  string *psVar23;
  aiVertexWeight *__s;
  Node *pNVar24;
  Logger *this_02;
  DeadlyImportError *pDVar25;
  long lVar26;
  ulong *puVar27;
  pointer pvVar28;
  long lVar29;
  ulong uVar30;
  pointer puVar31;
  size_t sVar32;
  ulong uVar33;
  int iVar34;
  unsigned_long *puVar35;
  size_type __n;
  ColladaLoader *this_03;
  aiBone *this_04;
  uint i;
  unsigned_long uVar36;
  size_t real;
  ulong uVar37;
  long lVar38;
  uint uVar39;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> uVar40;
  pointer ppaVar41;
  char *__s_00;
  pointer ppaVar42;
  bool bVar43;
  uint uVar44;
  ai_real aVar45;
  unique_ptr<aiMesh,_std::default_delete<aiMesh>_> dstMesh;
  int local_2a0;
  vector<aiMesh_*,_std::allocator<aiMesh_*>_> targetMeshes;
  vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
  dstBones;
  vector<float,_std::allocator<float>_> targetWeights;
  aiMesh *aimesh;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  Accessor *local_1f0;
  char *local_1e8 [4];
  vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
  weightStartPerVertex;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  
  this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       (__uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>)operator_new(0x520);
  aiMesh::aiMesh((aiMesh *)
                 this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                 super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                 super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl);
  uVar37 = (pSrcMesh->mName)._M_string_length;
  dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
       (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
       this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
       super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
       super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
  if (uVar37 < 0x400) {
    ((aiString *)
    ((long)this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
           super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
           super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xec))->length = (ai_uint32)uVar37;
    memcpy((char *)((long)this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                          super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xf0),
           (pSrcMesh->mName)._M_dataplus._M_p,uVar37);
    ((char *)((long)this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                    super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                    super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xf0))[uVar37] = '\0';
  }
  uVar37 = 0;
  for (lVar29 = 0; pSubMesh->mNumFaces << 3 != lVar29; lVar29 = lVar29 + 8) {
    uVar37 = uVar37 + *(long *)((long)(pSrcMesh->mFaceSize).
                                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                      ._M_impl.super__Vector_impl_data._M_start +
                               lVar29 + pStartFace * 8);
  }
  *(uint *)((long)this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 4) = (uint)uVar37;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = uVar37;
  sVar8 = SUB168(auVar6 * ZEXT816(0xc),0);
  uVar33 = 0xffffffffffffffff;
  if (SUB168(auVar6 * ZEXT816(0xc),8) == 0) {
    uVar33 = sVar8;
  }
  paVar9 = (aiVector3D *)operator_new__(uVar33);
  if (uVar37 == 0) {
    *(aiVector3D **)
     ((long)this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
            super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x10) = paVar9;
  }
  else {
    memset(paVar9,0,sVar8 - (sVar8 - 0xc) % 0xc);
    *(aiVector3D **)
     ((long)this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
            super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
            super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x10) = paVar9;
    memmove(paVar9,(pSrcMesh->mPositions).
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start + pStartVertex,sVar8);
  }
  paVar2 = (pSrcMesh->mNormals).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar1 = pStartVertex + uVar37;
  if (uVar1 <= (ulong)(((long)(pSrcMesh->mNormals).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2) / 0xc)) {
    paVar9 = (aiVector3D *)operator_new__(uVar33);
    if (uVar37 == 0) {
      *(aiVector3D **)
       ((long)this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
              super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
              super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x18) = paVar9;
    }
    else {
      memset(paVar9,0,sVar8 - (sVar8 - 0xc) % 0xc);
      *(aiVector3D **)
       ((long)this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
              super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
              super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x18) = paVar9;
      memmove(paVar9,paVar2 + pStartVertex,sVar8);
    }
  }
  paVar2 = (pSrcMesh->mTangents).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar1 <= (ulong)(((long)(pSrcMesh->mTangents).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2) / 0xc)) {
    paVar9 = (aiVector3D *)operator_new__(uVar33);
    if (uVar37 == 0) {
      *(aiVector3D **)
       ((long)this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
              super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
              super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x20) = paVar9;
    }
    else {
      memset(paVar9,0,sVar8 - (sVar8 - 0xc) % 0xc);
      *(aiVector3D **)
       ((long)this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
              super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
              super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x20) = paVar9;
      memmove(paVar9,paVar2 + pStartVertex,sVar8);
    }
  }
  paVar2 = (pSrcMesh->mBitangents).
           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (uVar1 <= (ulong)(((long)(pSrcMesh->mBitangents).
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)paVar2) / 0xc)) {
    paVar9 = (aiVector3D *)operator_new__(uVar33);
    if (uVar37 == 0) {
      *(aiVector3D **)
       ((long)this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
              super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
              super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x28) = paVar9;
    }
    else {
      memset(paVar9,0,sVar8 - (sVar8 - 0xc) % 0xc);
      *(aiVector3D **)
       ((long)this_00.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
              super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
              super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x28) = paVar9;
      memmove(paVar9,paVar2 + pStartVertex,sVar8);
    }
  }
  lVar38 = 0;
  for (lVar29 = 0; lVar29 != 8; lVar29 = lVar29 + 1) {
    if (uVar1 <= (ulong)(((long)pSrcMesh->mTexCoords[lVar29].
                                super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)pSrcMesh->mTexCoords[lVar29].
                               super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                               ._M_impl.super__Vector_impl_data._M_start) / 0xc)) {
      pvVar10 = operator_new__(uVar33);
      if (uVar37 != 0) {
        memset(pvVar10,0,((sVar8 - 0xc) - (sVar8 - 0xc) % 0xc) + 0xc);
      }
      *(void **)((long)dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t
                       .super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                       super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x70 + lVar38 * 8) =
           pvVar10;
      lVar26 = 0;
      uVar30 = uVar37;
      while (bVar43 = uVar30 != 0, uVar30 = uVar30 - 1, bVar43) {
        paVar2 = pSrcMesh->mTexCoords[lVar29].
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start;
        lVar3 = *(long *)((long)dstMesh._M_t.
                                super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                                super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x70 +
                         lVar38 * 8);
        *(undefined4 *)(lVar3 + 8 + lVar26) =
             *(undefined4 *)((long)(paVar2 + pStartVertex) + 8U + lVar26);
        *(undefined8 *)(lVar3 + lVar26) = *(undefined8 *)((long)(paVar2 + pStartVertex) + lVar26);
        lVar26 = lVar26 + 0xc;
      }
      *(uint *)((long)dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                      super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                      super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xb0 + lVar38 * 4) =
           pSrcMesh->mNumUVComponents[lVar29];
      lVar38 = lVar38 + 1;
    }
  }
  uVar33 = uVar37 << 4;
  lVar38 = 0;
  for (lVar29 = 0x178;
      uVar40._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
      super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
      super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
           dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
           super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
           super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl, lVar29 != 0x238;
      lVar29 = lVar29 + 0x18) {
    if (uVar1 <= (ulong)(*(long *)((long)&(pSrcMesh->mName)._M_string_length + lVar29) -
                         *(long *)((long)&(pSrcMesh->mName)._M_dataplus._M_p + lVar29) >> 4)) {
      pvVar10 = operator_new__(-(ulong)(uVar37 >> 0x3c != 0) | uVar33);
      if (uVar37 == 0) {
        *(void **)((long)dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                         _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                         super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x30 + lVar38 * 8) =
             pvVar10;
      }
      else {
        memset(pvVar10,0,uVar33);
        *(void **)((long)dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                         _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                         super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x30 + lVar38 * 8) =
             pvVar10;
        memmove(*(void **)((long)dstMesh._M_t.
                                 super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                                 super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                                 super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x30 +
                          lVar38 * 8),
                (void *)(*(long *)((long)&(pSrcMesh->mName)._M_dataplus._M_p + lVar29) +
                        pStartVertex * 0x10),uVar33);
      }
      lVar38 = lVar38 + 1;
    }
  }
  iVar34 = (int)pSubMesh->mNumFaces;
  uVar37 = pSubMesh->mNumFaces & 0xffffffff;
  *(int *)((long)dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                 super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                 super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8) = iVar34;
  puVar11 = (ulong *)operator_new__(uVar37 * 0x10 + 8);
  *puVar11 = uVar37;
  puVar11 = puVar11 + 1;
  if (iVar34 != 0) {
    puVar27 = puVar11;
    do {
      *(undefined4 *)puVar27 = 0;
      puVar27[1] = 0;
      puVar27 = puVar27 + 2;
    } while (puVar27 != puVar11 + uVar37 * 2);
  }
  *(ulong **)
   ((long)uVar40._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
          super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd0) = puVar11;
  iVar34 = 0;
  for (uVar37 = 0;
      uVar37 < *(uint *)((long)uVar40._M_t.
                               super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                               super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                               super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 8);
      uVar37 = uVar37 + 1) {
    uVar33 = (pSrcMesh->mFaceSize).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar37 + pStartFace];
    lVar29 = *(long *)((long)uVar40._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>
                             ._M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                             super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd0);
    *(int *)(lVar29 + uVar37 * 0x10) = (int)uVar33;
    pvVar10 = operator_new__(-(ulong)(uVar33 >> 0x3e != 0) | uVar33 * 4);
    lVar29 = lVar29 + uVar37 * 0x10;
    *(void **)(lVar29 + 8) = pvVar10;
    for (uVar30 = 0; uVar33 != uVar30; uVar30 = uVar30 + 1) {
      *(int *)(*(long *)(lVar29 + 8) + uVar30 * 4) = iVar34 + (int)uVar30;
    }
    iVar34 = iVar34 + (int)uVar30;
    uVar40 = dstMesh;
  }
  targetMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  targetMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  targetMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  targetWeights.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  targetWeights.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  targetWeights.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  pLibrary = &pParser->mAccessorLibrary;
  pLibrary_00 = &pParser->mDataLibrary;
  iVar34 = 0;
  for (p_Var17 = (pParser->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var17 !=
      &(pParser->mControllerLibrary)._M_t._M_impl.super__Rb_tree_header;
      p_Var17 = (_Base_ptr)std::_Rb_tree_increment(p_Var17)) {
    ppMVar12 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Mesh*>
                         (pParser,&pParser->mMeshLibrary,(string *)&p_Var17[2]._M_parent);
    if (p_Var17[2]._M_color == _S_black) {
      _Var7 = std::operator==(&(*ppMVar12)->mName,&pSrcMesh->mName);
      if (_Var7) {
        pAVar13 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                            (pParser,pLibrary,(string *)&p_Var17[0xc]._M_right);
        pAVar14 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                            (pParser,pLibrary,(string *)&p_Var17[0xd]._M_right);
        pDVar15 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                            (pParser,pLibrary_00,&pAVar13->mSource);
        pDVar16 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                            (pParser,pLibrary_00,&pAVar14->mSource);
        if (pDVar15->mIsStringArray == false) {
          pDVar25 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&animMeshes,"target data must contain id. ",
                     (allocator<char> *)&aimesh);
          DeadlyImportError::DeadlyImportError(pDVar25,(string *)&animMeshes);
          __cxa_throw(pDVar25,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        if (pDVar16->mIsStringArray != false) {
          pDVar25 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&animMeshes,"target weight data must not be textual ",
                     (allocator<char> *)&aimesh);
          DeadlyImportError::DeadlyImportError(pDVar25,(string *)&animMeshes);
          __cxa_throw(pDVar25,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        iVar34 = *(int *)&p_Var17[2].field_0x4;
        for (uVar39 = 0;
            (ulong)uVar39 <
            (ulong)((long)(pDVar15->mStrings).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pDVar15->mStrings).
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 5); uVar39 = uVar39 + 1) {
          pURL = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::at(&pDVar15->mStrings,(ulong)uVar39);
          ppMVar12 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Mesh*>
                               (pParser,&pParser->mMeshLibrary,pURL);
          pSrcMesh_00 = *ppMVar12;
          aimesh = findMesh(this,&pSrcMesh_00->mName);
          if (aimesh == (aiMesh *)0x0) {
            if (1 < (ulong)(((long)(pSrcMesh_00->mSubMeshes).
                                   super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                                   ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(pSrcMesh_00->mSubMeshes).
                                  super__Vector_base<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                                  ._M_impl.super__Vector_impl_data._M_start) / 0x28)) {
              pDVar25 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&animMeshes,"Morhing target mesh must be a single",
                         (allocator<char> *)local_1e8);
              DeadlyImportError::DeadlyImportError(pDVar25,(string *)&animMeshes);
              __cxa_throw(pDVar25,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
            }
            pSubMesh_00 = std::
                          vector<Assimp::Collada::SubMesh,_std::allocator<Assimp::Collada::SubMesh>_>
                          ::at(&pSrcMesh_00->mSubMeshes,0);
            aimesh = CreateMesh(this,pParser,pSrcMesh_00,pSubMesh_00,(Controller *)0x0,0,0);
            std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back
                      (&this->mTargetMeshes,&aimesh);
          }
          std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::push_back(&targetMeshes,&aimesh);
        }
        for (uVar39 = 0;
            (ulong)uVar39 <
            (ulong)((long)(pDVar16->mValues).super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(pDVar16->mValues).super__Vector_base<float,_std::allocator<float>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 2); uVar39 = uVar39 + 1) {
          __x = std::vector<float,_std::allocator<float>_>::at(&pDVar16->mValues,(ulong)uVar39);
          std::vector<float,_std::allocator<float>_>::push_back(&targetWeights,__x);
        }
      }
    }
  }
  if (((long)targetMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)targetMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start != 0) &&
     ((long)targetWeights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)targetWeights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start >> 2 ==
      (long)targetMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)targetMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
            super__Vector_impl_data._M_start >> 3)) {
    animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    for (uVar39 = 0;
        ppaVar42 = animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish,
        ppaVar41 = animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_start,
        uVar40._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
        super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
             dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
             super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
             super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl, uVar37 = (ulong)uVar39,
        uVar37 < (ulong)((long)targetMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)targetMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>.
                               _M_impl.super__Vector_impl_data._M_start >> 3); uVar39 = uVar39 + 1)
    {
      ppaVar18 = std::vector<aiMesh_*,_std::allocator<aiMesh_*>_>::at(&targetMeshes,uVar37);
      mesh = *ppaVar18;
      paVar19 = (aiMesh *)aiCreateAnimMesh(mesh);
      uVar44 = -(uint)(targetWeights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar37] == 0.0);
      *(uint *)((paVar19->mName).data + 0x3bc) =
           uVar44 & 0x3f800000 |
           ~uVar44 & (uint)targetWeights.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                           super__Vector_impl_data._M_start[uVar37];
      aimesh = paVar19;
      if (paVar19 != (aiMesh *)&mesh->mName) {
        uVar44 = (mesh->mName).length;
        ((aiString *)&paVar19->mPrimitiveTypes)->length = uVar44;
        memcpy(&paVar19->mNumVertices,(mesh->mName).data,(ulong)uVar44);
        *(undefined1 *)((long)paVar19->mColors + ((ulong)uVar44 - 0x2c)) = 0;
      }
      std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::push_back
                (&animMeshes,(value_type *)&aimesh);
    }
    *(uint *)((long)dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                    super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                    super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x500) = iVar34 == 1 | 2;
    uVar37 = (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3;
    pvVar10 = operator_new__(-(ulong)(uVar37 >> 0x3d != 0) |
                             (long)animMeshes.
                                   super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)animMeshes.
                                   super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start);
    *(void **)((long)uVar40._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                     super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                     super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x4f8) = pvVar10;
    *(int *)((long)uVar40._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                   super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                   super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x4f0) = (int)uVar37;
    for (uVar39 = 0; uVar37 = (ulong)uVar39, uVar37 < (ulong)((long)ppaVar42 - (long)ppaVar41 >> 3);
        uVar39 = uVar39 + 1) {
      ppaVar20 = std::vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::at(&animMeshes,uVar37);
      *(value_type *)
       (*(long *)((long)dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                        _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0x4f8) + uVar37 * 8) =
           *ppaVar20;
      ppaVar41 = animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppaVar42 = animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
    }
    std::_Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>::~_Vector_base
              (&animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>);
  }
  if ((pSrcController != (Controller *)0x0) && (pSrcController->mType == Skin)) {
    pAVar13 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pParser,pLibrary,&pSrcController->mJointNameSource);
    pDVar15 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                        (pParser,pLibrary_00,&pAVar13->mSource);
    pAVar14 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pParser,pLibrary,&pSrcController->mJointOffsetMatrixSource);
    pDVar16 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                        (pParser,pLibrary_00,&pAVar14->mSource);
    pAVar21 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pParser,pLibrary,&(pSrcController->mWeightInputJoints).mAccessor);
    if (pAVar21 != pAVar13) {
      pDVar25 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&animMeshes,
                 "Temporary implementational laziness. If you read this, please report to the author."
                 ,(allocator<char> *)&aimesh);
      DeadlyImportError::DeadlyImportError(pDVar25,(string *)&animMeshes);
      __cxa_throw(pDVar25,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    local_1f0 = pAVar14;
    pAVar14 = ColladaParser::ResolveLibraryReference<Assimp::Collada::Accessor>
                        (pParser,pLibrary,&(pSrcController->mWeightInputWeights).mAccessor);
    pData = ColladaParser::ResolveLibraryReference<Assimp::Collada::Data>
                      (pParser,pLibrary_00,&pAVar14->mSource);
    if (((pDVar15->mIsStringArray != true) || (pDVar16->mIsStringArray != false)) ||
       (pData->mIsStringArray == true)) {
      pDVar25 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&animMeshes,"Data type mismatch while resolving mesh joints",
                 (allocator<char> *)&aimesh);
      DeadlyImportError::DeadlyImportError(pDVar25,(string *)&animMeshes);
      __cxa_throw(pDVar25,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    if (((pSrcController->mWeightInputJoints).mOffset != 0) ||
       ((pSrcController->mWeightInputWeights).mOffset != 1)) {
      pDVar25 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&animMeshes,"Unsupported vertex_weight addressing scheme. ",
                 (allocator<char> *)&aimesh);
      DeadlyImportError::DeadlyImportError(pDVar25,(string *)&animMeshes);
      __cxa_throw(pDVar25,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
    }
    __n = (long)(pDVar15->mStrings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(pDVar15->mStrings).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start >> 5;
    std::
    vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
    ::vector(&dstBones,__n,(allocator_type *)&animMeshes);
    this_03 = (ColladaLoader *)&weightStartPerVertex;
    weightStartPerVertex.
    super__Vector_base<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    weightStartPerVertex.
    super__Vector_base<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    weightStartPerVertex.
    super__Vector_base<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         (pointer)(pSrcController->mWeights).
                  super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
    std::
    vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
    ::resize((vector<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
              *)this_03,
             (long)(pSrcController->mWeightCounts).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(pSrcController->mWeightCounts).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start >> 3,(value_type *)&animMeshes);
    puVar31 = (pSrcController->mWeightCounts).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppVar22 = (pSrcController->mWeights).
              super__Vector_base<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    for (uVar37 = 0;
        uVar37 < (ulong)((long)(pSrcController->mWeightCounts).
                               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (long)puVar31 >> 3);
        uVar37 = uVar37 + 1) {
      weightStartPerVertex.
      super__Vector_base<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start[uVar37]._M_current = ppVar22;
      puVar31 = (pSrcController->mWeightCounts).
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                super__Vector_impl_data._M_start;
      ppVar22 = ppVar22 + puVar31[uVar37];
    }
    for (sVar32 = pStartVertex;
        uVar40._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
        super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
        super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
             dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
             super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
             super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl, sVar32 < uVar1;
        sVar32 = sVar32 + 1) {
      uVar4 = (pSrcMesh->mFacePosIndices).
              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start[sVar32];
      uVar36 = (pSrcController->mWeightCounts).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start[uVar4];
      local_2a0 = (int)pStartVertex;
      puVar35 = &(weightStartPerVertex.
                  super__Vector_base<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar4]._M_current)->second;
      while (bVar43 = uVar36 != 0, uVar36 = uVar36 - 1, bVar43) {
        sVar5 = ((pair<unsigned_long,_unsigned_long> *)(puVar35 + -1))->first;
        aVar45 = 1.0;
        if ((pData->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start ==
            (pData->mValues).super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_finish) {
LAB_003e911a:
          animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
          super__Vector_impl_data._M_start = (pointer)CONCAT44(aVar45,(int)sVar32 - local_2a0);
          this_03 = (ColladaLoader *)
                    (dstBones.
                     super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + sVar5);
          std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>::push_back
                    ((vector<aiVertexWeight,_std::allocator<aiVertexWeight>_> *)this_03,
                     (value_type *)&animMeshes);
        }
        else {
          aVar45 = ReadFloat(this_03,pAVar14,pData,*puVar35,0);
          if (0.0 < aVar45) goto LAB_003e911a;
        }
        puVar35 = puVar35 + 2;
      }
    }
    uVar37 = 0;
    for (pvVar28 = dstBones.
                   super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        pvVar28 !=
        dstBones.
        super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish; pvVar28 = pvVar28 + 1) {
      uVar37 = uVar37 + ((pvVar28->
                         super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                         _M_impl.super__Vector_impl_data._M_finish !=
                        (pvVar28->
                        super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>)._M_impl
                        .super__Vector_impl_data._M_start);
    }
    *(int *)((long)dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                   super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                   super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xd8) = (int)uVar37;
    pvVar10 = operator_new__(-(ulong)(uVar37 >> 0x3d != 0) | uVar37 << 3);
    *(void **)((long)uVar40._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
                     super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                     super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xe0) = pvVar10;
    lVar29 = 8;
    lVar38 = 0;
    for (sVar32 = 0; __n != sVar32; sVar32 = sVar32 + 1) {
      if (*(long *)((long)dstBones.
                          super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start + lVar29 + -8) !=
          *(long *)((long)&((dstBones.
                             super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>).
                           _M_impl.super__Vector_impl_data._M_start + lVar29)) {
        this_01 = (aiBone *)operator_new(0x450);
        this_04 = this_01;
        aiBone::aiBone(this_01);
        psVar23 = ReadString_abi_cxx11_((ColladaLoader *)this_04,pAVar13,pDVar15,sVar32);
        uVar37 = psVar23->_M_string_length;
        if (uVar37 < 0x400) {
          (this_01->mName).length = (ai_uint32)uVar37;
          this_04 = (aiBone *)(this_01->mName).data;
          memcpy(this_04,(psVar23->_M_dataplus)._M_p,uVar37);
          (this_01->mName).data[uVar37] = '\0';
        }
        pAVar14 = local_1f0;
        aVar45 = ReadFloat((ColladaLoader *)this_04,local_1f0,pDVar16,sVar32,0);
        (this_01->mOffsetMatrix).a1 = aVar45;
        aVar45 = ReadFloat((ColladaLoader *)this_04,pAVar14,pDVar16,sVar32,1);
        (this_01->mOffsetMatrix).a2 = aVar45;
        aVar45 = ReadFloat((ColladaLoader *)this_04,pAVar14,pDVar16,sVar32,2);
        (this_01->mOffsetMatrix).a3 = aVar45;
        aVar45 = ReadFloat((ColladaLoader *)this_04,pAVar14,pDVar16,sVar32,3);
        (this_01->mOffsetMatrix).a4 = aVar45;
        aVar45 = ReadFloat((ColladaLoader *)this_04,pAVar14,pDVar16,sVar32,4);
        (this_01->mOffsetMatrix).b1 = aVar45;
        aVar45 = ReadFloat((ColladaLoader *)this_04,pAVar14,pDVar16,sVar32,5);
        (this_01->mOffsetMatrix).b2 = aVar45;
        aVar45 = ReadFloat((ColladaLoader *)this_04,pAVar14,pDVar16,sVar32,6);
        (this_01->mOffsetMatrix).b3 = aVar45;
        aVar45 = ReadFloat((ColladaLoader *)this_04,pAVar14,pDVar16,sVar32,7);
        (this_01->mOffsetMatrix).b4 = aVar45;
        aVar45 = ReadFloat((ColladaLoader *)this_04,pAVar14,pDVar16,sVar32,8);
        (this_01->mOffsetMatrix).c1 = aVar45;
        aVar45 = ReadFloat((ColladaLoader *)this_04,pAVar14,pDVar16,sVar32,9);
        (this_01->mOffsetMatrix).c2 = aVar45;
        aVar45 = ReadFloat((ColladaLoader *)this_04,pAVar14,pDVar16,sVar32,10);
        (this_01->mOffsetMatrix).c3 = aVar45;
        aVar45 = ReadFloat((ColladaLoader *)this_04,pAVar14,pDVar16,sVar32,0xb);
        pvVar28 = dstBones.
                  super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        (this_01->mOffsetMatrix).c4 = aVar45;
        uVar33 = *(long *)((long)&((dstBones.
                                    super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start)->
                                  super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                  )._M_impl.super__Vector_impl_data._M_start + lVar29) -
                 *(long *)((long)dstBones.
                                 super__Vector_base<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start + lVar29 + -8) >> 3;
        this_01->mNumWeights = (uint)uVar33;
        uVar33 = uVar33 & 0xffffffff;
        uVar37 = uVar33 * 8;
        __s = (aiVertexWeight *)operator_new__(uVar37);
        if (uVar33 != 0) {
          memset(__s,0,uVar37);
        }
        this_01->mWeights = __s;
        pvVar10 = *(void **)((long)pvVar28 + lVar29 + -8);
        sVar8 = *(long *)((long)&(pvVar28->
                                 super__Vector_base<aiVertexWeight,_std::allocator<aiVertexWeight>_>
                                 )._M_impl.super__Vector_impl_data._M_start + lVar29) -
                (long)pvVar10;
        if (sVar8 != 0) {
          memmove(__s,pvVar10,sVar8);
        }
        aimesh = *(aiMesh **)pSrcController->mBindShapeMatrix;
        uStack_230._0_4_ = pSrcController->mBindShapeMatrix[2];
        uStack_230._4_4_ = pSrcController->mBindShapeMatrix[3];
        local_228._0_4_ = pSrcController->mBindShapeMatrix[4];
        local_228._4_4_ = pSrcController->mBindShapeMatrix[5];
        uStack_220._0_4_ = pSrcController->mBindShapeMatrix[6];
        uStack_220._4_4_ = pSrcController->mBindShapeMatrix[7];
        local_218._0_4_ = pSrcController->mBindShapeMatrix[8];
        local_218._4_4_ = pSrcController->mBindShapeMatrix[9];
        uStack_210._0_4_ = pSrcController->mBindShapeMatrix[10];
        uStack_210._4_4_ = pSrcController->mBindShapeMatrix[0xb];
        local_208._0_4_ = pSrcController->mBindShapeMatrix[0xc];
        local_208._4_4_ = pSrcController->mBindShapeMatrix[0xd];
        uStack_200._0_4_ = pSrcController->mBindShapeMatrix[0xe];
        uStack_200._4_4_ = pSrcController->mBindShapeMatrix[0xf];
        aiMatrix4x4t<float>::operator*=(&this_01->mOffsetMatrix,(aiMatrix4x4t<float> *)&aimesh);
        pNVar24 = pParser->mRootNode;
        __s_00 = (this_01->mName).data;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&animMeshes,__s_00,(allocator<char> *)local_1e8);
        pNVar24 = FindNode(this,pNVar24,(string *)&animMeshes);
        std::__cxx11::string::~string((string *)&animMeshes);
        if (pNVar24 == (Node *)0x0) {
          pNVar24 = pParser->mRootNode;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&animMeshes,__s_00,(allocator<char> *)local_1e8);
          pNVar24 = FindNodeBySID(this,pNVar24,(string *)&animMeshes);
          std::__cxx11::string::~string((string *)&animMeshes);
          if (pNVar24 != (Node *)0x0) goto LAB_003e94c4;
          this_02 = DefaultLogger::get();
          Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
          basic_formatter<char[75]>
                    ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &animMeshes,
                     (char (*) [75])
                     "ColladaLoader::CreateMesh(): could not find corresponding node for joint \"");
          std::operator<<((ostream *)&animMeshes,__s_00);
          std::operator<<((ostream *)&animMeshes,"\".");
          std::__cxx11::stringbuf::str();
          Logger::warn(this_02,local_1e8[0]);
          std::__cxx11::string::~string((string *)local_1e8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&animMeshes);
        }
        else {
LAB_003e94c4:
          FindNameForNode_abi_cxx11_((string *)&animMeshes,this,pNVar24);
          ppaVar41 = animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish;
          if (animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish < (pointer)0x400) {
            (this_01->mName).length =
                 (ai_uint32)
                 animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            memcpy(__s_00,animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                   (size_t)animMeshes.
                           super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                           super__Vector_impl_data._M_finish);
            (this_01->mName).data[(long)ppaVar41] = '\0';
          }
          std::__cxx11::string::~string((string *)&animMeshes);
        }
        *(aiBone **)
         (*(long *)((long)dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>.
                          _M_t.super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
                          super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl + 0xe0) + lVar38 * 8)
             = this_01;
        lVar38 = lVar38 + 1;
      }
      lVar29 = lVar29 + 0x18;
    }
    std::
    _Vector_base<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
    ::~_Vector_base(&weightStartPerVertex.
                     super__Vector_base<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<const_std::pair<unsigned_long,_unsigned_long>_*,_std::vector<std::pair<unsigned_long,_unsigned_long>,_std::allocator<std::pair<unsigned_long,_unsigned_long>_>_>_>_>_>
                   );
    std::
    vector<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>,_std::allocator<std::vector<aiVertexWeight,_std::allocator<aiVertexWeight>_>_>_>
    ::~vector(&dstBones);
  }
  uVar40._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
       super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
       super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
  dstMesh._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
  super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
  super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl =
       (__uniq_ptr_data<aiMesh,_std::default_delete<aiMesh>,_true,_true>)
       (__uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>)0x0;
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&targetWeights.super__Vector_base<float,_std::allocator<float>_>);
  std::_Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>::~_Vector_base
            (&targetMeshes.super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>);
  std::unique_ptr<aiMesh,_std::default_delete<aiMesh>_>::~unique_ptr(&dstMesh);
  return (aiMesh *)
         (__uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>)
         uVar40._M_t.super___uniq_ptr_impl<aiMesh,_std::default_delete<aiMesh>_>._M_t.
         super__Tuple_impl<0UL,_aiMesh_*,_std::default_delete<aiMesh>_>.
         super__Head_base<0UL,_aiMesh_*,_false>._M_head_impl;
}

Assistant:

aiMesh* ColladaLoader::CreateMesh(const ColladaParser& pParser, const Collada::Mesh* pSrcMesh, const Collada::SubMesh& pSubMesh,
    const Collada::Controller* pSrcController, size_t pStartVertex, size_t pStartFace) {
    std::unique_ptr<aiMesh> dstMesh(new aiMesh);

    dstMesh->mName = pSrcMesh->mName;

    // count the vertices addressed by its faces
    const size_t numVertices = std::accumulate(pSrcMesh->mFaceSize.begin() + pStartFace,
        pSrcMesh->mFaceSize.begin() + pStartFace + pSubMesh.mNumFaces, size_t(0));

    // copy positions
    dstMesh->mNumVertices = static_cast<unsigned int>(numVertices);
    dstMesh->mVertices = new aiVector3D[numVertices];
    std::copy(pSrcMesh->mPositions.begin() + pStartVertex, pSrcMesh->mPositions.begin() +
        pStartVertex + numVertices, dstMesh->mVertices);

    // normals, if given. HACK: (thom) Due to the glorious Collada spec we never
    // know if we have the same number of normals as there are positions. So we
    // also ignore any vertex attribute if it has a different count
    if (pSrcMesh->mNormals.size() >= pStartVertex + numVertices) {
        dstMesh->mNormals = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mNormals.begin() + pStartVertex, pSrcMesh->mNormals.begin() +
            pStartVertex + numVertices, dstMesh->mNormals);
    }

    // tangents, if given.
    if (pSrcMesh->mTangents.size() >= pStartVertex + numVertices) {
        dstMesh->mTangents = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mTangents.begin() + pStartVertex, pSrcMesh->mTangents.begin() +
            pStartVertex + numVertices, dstMesh->mTangents);
    }

    // bitangents, if given.
    if (pSrcMesh->mBitangents.size() >= pStartVertex + numVertices) {
        dstMesh->mBitangents = new aiVector3D[numVertices];
        std::copy(pSrcMesh->mBitangents.begin() + pStartVertex, pSrcMesh->mBitangents.begin() +
            pStartVertex + numVertices, dstMesh->mBitangents);
    }

    // same for texturecoords, as many as we have
    // empty slots are not allowed, need to pack and adjust UV indexes accordingly
    for (size_t a = 0, real = 0; a < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++a) {
        if (pSrcMesh->mTexCoords[a].size() >= pStartVertex + numVertices) {
            dstMesh->mTextureCoords[real] = new aiVector3D[numVertices];
            for (size_t b = 0; b < numVertices; ++b) {
                dstMesh->mTextureCoords[real][b] = pSrcMesh->mTexCoords[a][pStartVertex + b];
            }

            dstMesh->mNumUVComponents[real] = pSrcMesh->mNumUVComponents[a];
            ++real;
        }
    }

    // same for vertex colors, as many as we have. again the same packing to avoid empty slots
    for (size_t a = 0, real = 0; a < AI_MAX_NUMBER_OF_COLOR_SETS; ++a) {
        if (pSrcMesh->mColors[a].size() >= pStartVertex + numVertices) {
            dstMesh->mColors[real] = new aiColor4D[numVertices];
            std::copy(pSrcMesh->mColors[a].begin() + pStartVertex, pSrcMesh->mColors[a].begin() + pStartVertex + numVertices, dstMesh->mColors[real]);
            ++real;
        }
    }

    // create faces. Due to the fact that each face uses unique vertices, we can simply count up on each vertex
    size_t vertex = 0;
    dstMesh->mNumFaces = static_cast<unsigned int>(pSubMesh.mNumFaces);
    dstMesh->mFaces = new aiFace[dstMesh->mNumFaces];
    for (size_t a = 0; a < dstMesh->mNumFaces; ++a) {
        size_t s = pSrcMesh->mFaceSize[pStartFace + a];
        aiFace& face = dstMesh->mFaces[a];
        face.mNumIndices = static_cast<unsigned int>(s);
        face.mIndices = new unsigned int[s];
        for (size_t b = 0; b < s; ++b) {
            face.mIndices[b] = static_cast<unsigned int>(vertex++);
        }
    }

    // create morph target meshes if any
    std::vector<aiMesh*> targetMeshes;
    std::vector<float> targetWeights;
    Collada::MorphMethod method = Collada::Normalized;

    for (std::map<std::string, Collada::Controller>::const_iterator it = pParser.mControllerLibrary.begin();
        it != pParser.mControllerLibrary.end(); ++it) {
        const Collada::Controller &c = it->second;
        const Collada::Mesh* baseMesh = pParser.ResolveLibraryReference(pParser.mMeshLibrary, c.mMeshId);

        if (c.mType == Collada::Morph && baseMesh->mName == pSrcMesh->mName) {
            const Collada::Accessor& targetAccessor = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, c.mMorphTarget);
            const Collada::Accessor& weightAccessor = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, c.mMorphWeight);
            const Collada::Data& targetData = pParser.ResolveLibraryReference(pParser.mDataLibrary, targetAccessor.mSource);
            const Collada::Data& weightData = pParser.ResolveLibraryReference(pParser.mDataLibrary, weightAccessor.mSource);

            // take method
            method = c.mMethod;

            if (!targetData.mIsStringArray) {
                throw DeadlyImportError("target data must contain id. ");
            }
            if (weightData.mIsStringArray) {
                throw DeadlyImportError("target weight data must not be textual ");
            }

            for (unsigned int i = 0; i < targetData.mStrings.size(); ++i) {
                const Collada::Mesh* targetMesh = pParser.ResolveLibraryReference(pParser.mMeshLibrary, targetData.mStrings.at(i));

                aiMesh *aimesh = findMesh(targetMesh->mName);
                if (!aimesh) {
                    if (targetMesh->mSubMeshes.size() > 1) {
                        throw DeadlyImportError("Morhing target mesh must be a single");
                    }
                    aimesh = CreateMesh(pParser, targetMesh, targetMesh->mSubMeshes.at(0), NULL, 0, 0);
                    mTargetMeshes.push_back(aimesh);
                }
                targetMeshes.push_back(aimesh);
            }
            for (unsigned int i = 0; i < weightData.mValues.size(); ++i) {
                targetWeights.push_back(weightData.mValues.at(i));
            }
        }
    }
    if (targetMeshes.size() > 0 && targetWeights.size() == targetMeshes.size()) {
        std::vector<aiAnimMesh*> animMeshes;
        for (unsigned int i = 0; i < targetMeshes.size(); ++i) {
            aiMesh* targetMesh = targetMeshes.at(i);
            aiAnimMesh *animMesh = aiCreateAnimMesh(targetMesh);
            float weight = targetWeights[i];
            animMesh->mWeight = weight == 0 ? 1.0f : weight;
            animMesh->mName = targetMesh->mName;
            animMeshes.push_back(animMesh);
        }
        dstMesh->mMethod = (method == Collada::Relative)
            ? aiMorphingMethod_MORPH_RELATIVE
            : aiMorphingMethod_MORPH_NORMALIZED;
        dstMesh->mAnimMeshes = new aiAnimMesh*[animMeshes.size()];
        dstMesh->mNumAnimMeshes = static_cast<unsigned int>(animMeshes.size());
        for (unsigned int i = 0; i < animMeshes.size(); ++i) {
            dstMesh->mAnimMeshes[i] = animMeshes.at(i);
        }
    }

    // create bones if given
    if (pSrcController && pSrcController->mType == Collada::Skin) {
        // resolve references - joint names
        const Collada::Accessor& jointNamesAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mJointNameSource);
        const Collada::Data& jointNames = pParser.ResolveLibraryReference(pParser.mDataLibrary, jointNamesAcc.mSource);
        // joint offset matrices
        const Collada::Accessor& jointMatrixAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mJointOffsetMatrixSource);
        const Collada::Data& jointMatrices = pParser.ResolveLibraryReference(pParser.mDataLibrary, jointMatrixAcc.mSource);
        // joint vertex_weight name list - should refer to the same list as the joint names above. If not, report and reconsider
        const Collada::Accessor& weightNamesAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mWeightInputJoints.mAccessor);
        if (&weightNamesAcc != &jointNamesAcc)
            throw DeadlyImportError("Temporary implementational laziness. If you read this, please report to the author.");
        // vertex weights
        const Collada::Accessor& weightsAcc = pParser.ResolveLibraryReference(pParser.mAccessorLibrary, pSrcController->mWeightInputWeights.mAccessor);
        const Collada::Data& weights = pParser.ResolveLibraryReference(pParser.mDataLibrary, weightsAcc.mSource);

        if (!jointNames.mIsStringArray || jointMatrices.mIsStringArray || weights.mIsStringArray)
            throw DeadlyImportError("Data type mismatch while resolving mesh joints");
        // sanity check: we rely on the vertex weights always coming as pairs of BoneIndex-WeightIndex
        if (pSrcController->mWeightInputJoints.mOffset != 0 || pSrcController->mWeightInputWeights.mOffset != 1)
            throw DeadlyImportError("Unsupported vertex_weight addressing scheme. ");

        // create containers to collect the weights for each bone
        size_t numBones = jointNames.mStrings.size();
        std::vector<std::vector<aiVertexWeight> > dstBones(numBones);

        // build a temporary array of pointers to the start of each vertex's weights
        typedef std::vector< std::pair<size_t, size_t> > IndexPairVector;
        std::vector<IndexPairVector::const_iterator> weightStartPerVertex;
        weightStartPerVertex.resize(pSrcController->mWeightCounts.size(), pSrcController->mWeights.end());

        IndexPairVector::const_iterator pit = pSrcController->mWeights.begin();
        for (size_t a = 0; a < pSrcController->mWeightCounts.size(); ++a) {
            weightStartPerVertex[a] = pit;
            pit += pSrcController->mWeightCounts[a];
        }

        // now for each vertex put the corresponding vertex weights into each bone's weight collection
        for (size_t a = pStartVertex; a < pStartVertex + numVertices; ++a) {
            // which position index was responsible for this vertex? that's also the index by which
            // the controller assigns the vertex weights
            size_t orgIndex = pSrcMesh->mFacePosIndices[a];
            // find the vertex weights for this vertex
            IndexPairVector::const_iterator iit = weightStartPerVertex[orgIndex];
            size_t pairCount = pSrcController->mWeightCounts[orgIndex];


            for( size_t b = 0; b < pairCount; ++b, ++iit) {
                const size_t jointIndex = iit->first;
                const size_t vertexIndex = iit->second;                
                ai_real weight = 1.0f;
                if (!weights.mValues.empty()) {
                    weight = ReadFloat(weightsAcc, weights, vertexIndex, 0);
                }

                // one day I gonna kill that XSI Collada exporter
                if (weight > 0.0f)
                {
                    aiVertexWeight w;
                    w.mVertexId = static_cast<unsigned int>(a - pStartVertex);
                    w.mWeight = weight;
                    dstBones[jointIndex].push_back(w);
                }
            }
        }

        // count the number of bones which influence vertices of the current submesh
        size_t numRemainingBones = 0;
        for( std::vector<std::vector<aiVertexWeight> >::const_iterator it = dstBones.begin(); it != dstBones.end(); ++it) {
            if( it->size() > 0) {
                ++numRemainingBones;
            }
        }

        // create bone array and copy bone weights one by one
        dstMesh->mNumBones = static_cast<unsigned int>(numRemainingBones);
        dstMesh->mBones = new aiBone*[numRemainingBones];
        size_t boneCount = 0;
        for( size_t a = 0; a < numBones; ++a) {
            // omit bones without weights
            if( dstBones[a].empty() ) {
                continue;
            }

            // create bone with its weights
            aiBone* bone = new aiBone;
            bone->mName = ReadString(jointNamesAcc, jointNames, a);
            bone->mOffsetMatrix.a1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 0);
            bone->mOffsetMatrix.a2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 1);
            bone->mOffsetMatrix.a3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 2);
            bone->mOffsetMatrix.a4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 3);
            bone->mOffsetMatrix.b1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 4);
            bone->mOffsetMatrix.b2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 5);
            bone->mOffsetMatrix.b3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 6);
            bone->mOffsetMatrix.b4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 7);
            bone->mOffsetMatrix.c1 = ReadFloat(jointMatrixAcc, jointMatrices, a, 8);
            bone->mOffsetMatrix.c2 = ReadFloat(jointMatrixAcc, jointMatrices, a, 9);
            bone->mOffsetMatrix.c3 = ReadFloat(jointMatrixAcc, jointMatrices, a, 10);
            bone->mOffsetMatrix.c4 = ReadFloat(jointMatrixAcc, jointMatrices, a, 11);
            bone->mNumWeights = static_cast<unsigned int>(dstBones[a].size());
            bone->mWeights = new aiVertexWeight[bone->mNumWeights];
            std::copy(dstBones[a].begin(), dstBones[a].end(), bone->mWeights);

            // apply bind shape matrix to offset matrix
            aiMatrix4x4 bindShapeMatrix;
            bindShapeMatrix.a1 = pSrcController->mBindShapeMatrix[0];
            bindShapeMatrix.a2 = pSrcController->mBindShapeMatrix[1];
            bindShapeMatrix.a3 = pSrcController->mBindShapeMatrix[2];
            bindShapeMatrix.a4 = pSrcController->mBindShapeMatrix[3];
            bindShapeMatrix.b1 = pSrcController->mBindShapeMatrix[4];
            bindShapeMatrix.b2 = pSrcController->mBindShapeMatrix[5];
            bindShapeMatrix.b3 = pSrcController->mBindShapeMatrix[6];
            bindShapeMatrix.b4 = pSrcController->mBindShapeMatrix[7];
            bindShapeMatrix.c1 = pSrcController->mBindShapeMatrix[8];
            bindShapeMatrix.c2 = pSrcController->mBindShapeMatrix[9];
            bindShapeMatrix.c3 = pSrcController->mBindShapeMatrix[10];
            bindShapeMatrix.c4 = pSrcController->mBindShapeMatrix[11];
            bindShapeMatrix.d1 = pSrcController->mBindShapeMatrix[12];
            bindShapeMatrix.d2 = pSrcController->mBindShapeMatrix[13];
            bindShapeMatrix.d3 = pSrcController->mBindShapeMatrix[14];
            bindShapeMatrix.d4 = pSrcController->mBindShapeMatrix[15];
            bone->mOffsetMatrix *= bindShapeMatrix;

            // HACK: (thom) Some exporters address the bone nodes by SID, others address them by ID or even name.
            // Therefore I added a little name replacement here: I search for the bone's node by either name, ID or SID,
            // and replace the bone's name by the node's name so that the user can use the standard
            // find-by-name method to associate nodes with bones.
            const Collada::Node* bnode = FindNode( pParser.mRootNode, bone->mName.data);
            if( !bnode) {
                bnode = FindNodeBySID( pParser.mRootNode, bone->mName.data);
            }

            // assign the name that we would have assigned for the source node
            if( bnode) {
                bone->mName.Set( FindNameForNode( bnode));
            } else {
                ASSIMP_LOG_WARN_F( "ColladaLoader::CreateMesh(): could not find corresponding node for joint \"", bone->mName.data, "\"." );
            }

            // and insert bone
            dstMesh->mBones[boneCount++] = bone;
        }
    }

    return dstMesh.release();
}